

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O3

int i2d_ECPrivateKey(EC_KEY *key,uchar **out)

{
  int iVar1;
  uint enc_flags;
  CBB cbb;
  CBB local_40;
  
  iVar1 = CBB_init(&local_40,0);
  if (iVar1 != 0) {
    enc_flags = EC_KEY_get_enc_flags(key);
    iVar1 = EC_KEY_marshal_private_key(&local_40,(EC_KEY *)key,enc_flags);
    if (iVar1 != 0) {
      iVar1 = CBB_finish_i2d(&local_40,out);
      return iVar1;
    }
  }
  CBB_cleanup(&local_40);
  return -1;
}

Assistant:

int i2d_ECPrivateKey(const EC_KEY *key, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !EC_KEY_marshal_private_key(&cbb, key, EC_KEY_get_enc_flags(key))) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}